

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_Error tt_cmap14_validate(FT_Byte *table,FT_Validator valid)

{
  byte bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  FT_ULong gid;
  FT_ULong uni;
  FT_ULong lastUni;
  FT_ULong i_1;
  FT_ULong numMappings;
  FT_Byte *ndp;
  FT_ULong cnt;
  FT_ULong base;
  FT_ULong lastBase;
  FT_ULong i;
  FT_ULong numRanges;
  FT_Byte *defp;
  FT_ULong nondefOff;
  FT_ULong defOff;
  FT_ULong varSel;
  FT_ULong lastVarSel;
  FT_ULong n;
  FT_ULong num_selectors;
  FT_ULong length;
  FT_Byte *p;
  FT_Validator valid_local;
  FT_Byte *table_local;
  
  if (valid->limit < table + 10) {
    ft_validator_error(valid,8);
  }
  uVar4 = (ulong)((uint)table[2] << 0x18 | (uint)table[3] << 0x10 | (uint)table[4] << 8 |
                 (uint)table[5]);
  uVar5 = (ulong)((uint)table[6] << 0x18 | (uint)table[7] << 0x10 | (uint)table[8] << 8 |
                 (uint)table[9]);
  if ((((ulong)((long)valid->limit - (long)table) < uVar4) || (uVar4 < 10)) ||
     ((uVar4 - 10) / 0xb < uVar5)) {
    ft_validator_error(valid,8);
  }
  varSel = 1;
  length = (FT_ULong)(table + 10);
  for (lastVarSel = 0; lastVarSel < uVar5; lastVarSel = lastVarSel + 1) {
    uVar6 = (ulong)((uint)*(byte *)length << 0x10 | (uint)*(byte *)(length + 1) << 8 |
                   (uint)*(byte *)(length + 2));
    uVar7 = (ulong)((uint)*(byte *)(length + 3) << 0x18 | (uint)*(byte *)(length + 4) << 0x10 |
                    (uint)*(byte *)(length + 5) << 8 | (uint)*(byte *)(length + 6));
    uVar8 = (ulong)((uint)*(byte *)(length + 7) << 0x18 | (uint)*(byte *)(length + 8) << 0x10 |
                    (uint)*(byte *)(length + 9) << 8 | (uint)*(byte *)(length + 10));
    if ((uVar4 <= uVar7) || (uVar4 <= uVar8)) {
      ft_validator_error(valid,8);
    }
    if (uVar6 < varSel) {
      ft_validator_error(valid,8);
    }
    varSel = uVar6 + 1;
    if (uVar7 != 0) {
      pbVar9 = table + uVar7;
      base = 0;
      if (valid->limit < pbVar9 + 4) {
        ft_validator_error(valid,8);
      }
      numRanges = (FT_ULong)(pbVar9 + 4);
      uVar6 = (ulong)((uint)*pbVar9 << 0x18 | (uint)pbVar9[1] << 0x10 | (uint)pbVar9[2] << 8 |
                     (uint)pbVar9[3]);
      if ((long)valid->limit - numRanges >> 2 < uVar6) {
        ft_validator_error(valid,8);
      }
      for (lastBase = 0; lastBase < uVar6; lastBase = lastBase + 1) {
        pbVar9 = (byte *)(numRanges + 3);
        uVar7 = (ulong)((uint)*(byte *)numRanges << 0x10 | (uint)*(byte *)(numRanges + 1) << 8 |
                       (uint)*(byte *)(numRanges + 2));
        numRanges = numRanges + 4;
        bVar1 = *pbVar9;
        if (0x10ffff < uVar7 + bVar1) {
          ft_validator_error(valid,8);
        }
        if (uVar7 < base) {
          ft_validator_error(valid,8);
        }
        base = uVar7 + bVar1 + 1;
      }
    }
    if (uVar8 != 0) {
      pbVar9 = table + uVar8;
      uni = 0;
      if (valid->limit < pbVar9 + 4) {
        ft_validator_error(valid,8);
      }
      uVar6 = (ulong)((uint)*pbVar9 << 0x18 | (uint)pbVar9[1] << 0x10 | (uint)pbVar9[2] << 8 |
                     (uint)pbVar9[3]);
      if ((ulong)((long)valid->limit - (long)(pbVar9 + 4)) / 5 < uVar6) {
        ft_validator_error(valid,8);
      }
      numMappings = (FT_ULong)(pbVar9 + 4);
      for (lastUni = 0; lastUni < uVar6; lastUni = lastUni + 1) {
        uVar7 = (ulong)((uint)*(byte *)numMappings << 0x10 | (uint)*(byte *)(numMappings + 1) << 8 |
                       (uint)*(byte *)(numMappings + 2));
        uVar2 = *(undefined1 *)(numMappings + 3);
        uVar3 = *(undefined1 *)(numMappings + 4);
        if (0x10ffff < uVar7) {
          ft_validator_error(valid,8);
        }
        if (uVar7 < uni) {
          ft_validator_error(valid,8);
        }
        uni = uVar7 + 1;
        if ((valid->level != FT_VALIDATE_DEFAULT) &&
           ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <= (uint)CONCAT11(uVar2,uVar3))) {
          ft_validator_error(valid,0x10);
        }
        numMappings = numMappings + 5;
      }
    }
    length = length + 0xb;
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap14_validate( FT_Byte*      table,
                      FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_ULong  length;
    FT_ULong  num_selectors;


    if ( table + 2 + 4 + 4 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p             = table + 2;
    length        = TT_NEXT_ULONG( p );
    num_selectors = TT_NEXT_ULONG( p );

    if ( length > (FT_ULong)( valid->limit - table ) ||
         /* length < 10 + 11 * num_selectors ? */
         length < 10                                 ||
         ( length - 10 ) / 11 < num_selectors        )
      FT_INVALID_TOO_SHORT;

    /* check selectors, they must be in increasing order */
    {
      /* we start lastVarSel at 1 because a variant selector value of 0
       * isn't valid.
       */
      FT_ULong  n, lastVarSel = 1;


      for ( n = 0; n < num_selectors; n++ )
      {
        FT_ULong  varSel    = TT_NEXT_UINT24( p );
        FT_ULong  defOff    = TT_NEXT_ULONG( p );
        FT_ULong  nondefOff = TT_NEXT_ULONG( p );


        if ( defOff >= length || nondefOff >= length )
          FT_INVALID_TOO_SHORT;

        if ( varSel < lastVarSel )
          FT_INVALID_DATA;

        lastVarSel = varSel + 1;

        /* check the default table (these glyphs should be reached     */
        /* through the normal Unicode cmap, no GIDs, just check order) */
        if ( defOff != 0 )
        {
          FT_Byte*  defp     = table + defOff;
          FT_ULong  numRanges;
          FT_ULong  i;
          FT_ULong  lastBase = 0;


          if ( defp + 4 > valid->limit )
            FT_INVALID_TOO_SHORT;

          numRanges = TT_NEXT_ULONG( defp );

          /* defp + numRanges * 4 > valid->limit ? */
          if ( numRanges > (FT_ULong)( valid->limit - defp ) / 4 )
            FT_INVALID_TOO_SHORT;

          for ( i = 0; i < numRanges; i++ )
          {
            FT_ULong  base = TT_NEXT_UINT24( defp );
            FT_ULong  cnt  = FT_NEXT_BYTE( defp );


            if ( base + cnt >= 0x110000UL )              /* end of Unicode */
              FT_INVALID_DATA;

            if ( base < lastBase )
              FT_INVALID_DATA;

            lastBase = base + cnt + 1U;
          }
        }

        /* and the non-default table (these glyphs are specified here) */
        if ( nondefOff != 0 )
        {
          FT_Byte*  ndp        = table + nondefOff;
          FT_ULong  numMappings;
          FT_ULong  i, lastUni = 0;


          if ( ndp + 4 > valid->limit )
            FT_INVALID_TOO_SHORT;

          numMappings = TT_NEXT_ULONG( ndp );

          /* numMappings * 5 > (FT_ULong)( valid->limit - ndp ) ? */
          if ( numMappings > ( (FT_ULong)( valid->limit - ndp ) ) / 5 )
            FT_INVALID_TOO_SHORT;

          for ( i = 0; i < numMappings; i++ )
          {
            FT_ULong  uni = TT_NEXT_UINT24( ndp );
            FT_ULong  gid = TT_NEXT_USHORT( ndp );


            if ( uni >= 0x110000UL )                     /* end of Unicode */
              FT_INVALID_DATA;

            if ( uni < lastUni )
              FT_INVALID_DATA;

            lastUni = uni + 1U;

            if ( valid->level >= FT_VALIDATE_TIGHT    &&
                 gid >= TT_VALID_GLYPH_COUNT( valid ) )
              FT_INVALID_GLYPH_ID;
          }
        }
      }
    }

    return FT_Err_Ok;
  }